

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::compressedteximage2d_invalid_size
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar5;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_VALUE is generated if imageSize is not consistent with the format, dimensions, and contents of the specified compressed image data."
             ,&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pNVar1 = local_10;
  iVar3 = divRoundUp(1,4);
  iVar4 = divRoundUp(1,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,0x9270,1,1,0,iVar3 * iVar4 * 8 + -1,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  pNVar1 = local_10;
  iVar3 = divRoundUp(1,4);
  iVar4 = divRoundUp(1,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,0x9271,1,1,0,iVar3 * iVar4 * 8 + -1,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  pNVar1 = local_10;
  iVar3 = divRoundUp(1,4);
  iVar4 = divRoundUp(1,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,0x9272,1,1,0,iVar3 * iVar4 * 0x10 + -1,
             (void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  pNVar1 = local_10;
  iVar3 = divRoundUp(1,4);
  iVar4 = divRoundUp(1,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,0x9273,1,1,0,iVar3 * iVar4 * 0x10 + -1,
             (void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  pNVar1 = local_10;
  iVar3 = divRoundUp(1,4);
  iVar4 = divRoundUp(1,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,0x9274,1,1,0,iVar3 * iVar4 * 8 + -1,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  pNVar1 = local_10;
  iVar3 = divRoundUp(1,4);
  iVar4 = divRoundUp(1,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,0x9275,1,1,0,iVar3 * iVar4 * 8 + -1,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  pNVar1 = local_10;
  iVar3 = divRoundUp(1,4);
  iVar4 = divRoundUp(1,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,0x9276,1,1,0,iVar3 * iVar4 * 8 + -1,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  pNVar1 = local_10;
  iVar3 = divRoundUp(1,4);
  iVar4 = divRoundUp(1,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,0x9277,1,1,0,iVar3 * iVar4 * 8 + -1,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  pNVar1 = local_10;
  iVar3 = divRoundUp(1,4);
  iVar4 = divRoundUp(1,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,0x9278,1,1,0,iVar3 * iVar4 * 0x10 + -1,
             (void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  pNVar1 = local_10;
  iVar3 = divRoundUp(1,4);
  iVar4 = divRoundUp(1,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,0x9279,1,1,0,iVar3 * iVar4 * 0x10 + -1,
             (void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  pRVar5 = NegativeTestContext::getRenderContext(local_10);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(ctxType,requiredApiType);
  pNVar1 = local_10;
  if (bVar2) {
    iVar3 = divRoundUp(1,4);
    iVar4 = divRoundUp(1,4);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93b0,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,5);
    iVar4 = divRoundUp(1,4);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93b1,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,5);
    iVar4 = divRoundUp(1,5);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93b2,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,6);
    iVar4 = divRoundUp(1,5);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93b3,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,6);
    iVar4 = divRoundUp(1,6);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93b4,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,8);
    iVar4 = divRoundUp(1,5);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93b5,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,8);
    iVar4 = divRoundUp(1,6);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93b6,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,8);
    iVar4 = divRoundUp(1,8);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93b7,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,10);
    iVar4 = divRoundUp(1,5);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93b8,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,10);
    iVar4 = divRoundUp(1,6);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93b9,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,10);
    iVar4 = divRoundUp(1,8);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93ba,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,10);
    iVar4 = divRoundUp(1,10);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93bb,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,0xc);
    iVar4 = divRoundUp(1,10);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93bc,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,0xc);
    iVar4 = divRoundUp(1,0xc);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93bd,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,4);
    iVar4 = divRoundUp(1,4);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93d0,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,5);
    iVar4 = divRoundUp(1,4);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93d1,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,5);
    iVar4 = divRoundUp(1,5);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93d2,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,6);
    iVar4 = divRoundUp(1,5);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93d3,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,6);
    iVar4 = divRoundUp(1,6);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93d4,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,8);
    iVar4 = divRoundUp(1,5);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93d5,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,8);
    iVar4 = divRoundUp(1,6);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93d6,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,8);
    iVar4 = divRoundUp(1,8);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93d7,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,10);
    iVar4 = divRoundUp(1,5);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93d8,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,10);
    iVar4 = divRoundUp(1,6);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93d9,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,10);
    iVar4 = divRoundUp(1,8);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93da,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,10);
    iVar4 = divRoundUp(1,10);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93db,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,0xc);
    iVar4 = divRoundUp(1,10);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93dc,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
    pNVar1 = local_10;
    iVar3 = divRoundUp(1,0xc);
    iVar4 = divRoundUp(1,0xc);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&pNVar1->super_CallLogWrapper,0xde1,0,0x93dd,1,1,0,iVar3 * iVar4 * 0x10 + -1,
               (void *)0x0);
    NegativeTestContext::expectError(local_10,0x501);
  }
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void compressedteximage2d_invalid_size (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if imageSize is not consistent with the format, dimensions, and contents of the specified compressed image data.");
	// Subtracting 1 to the imageSize field to deviate from the expected size. Removing the -1 would cause the imageSize to be correct.
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_R11_EAC, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 8 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SIGNED_R11_EAC, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 8 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RG11_EAC, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 16 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SIGNED_RG11_EAC, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 16 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGB8_ETC2, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 8 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ETC2, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 8 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 8 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 8 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 16 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 16 - 1, 0);
	ctx.expectError(GL_INVALID_VALUE);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_4x4, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_5x4, 1, 1, 0, divRoundUp(1, 5) * divRoundUp(1, 4) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_5x5, 1, 1, 0, divRoundUp(1, 5) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_6x5, 1, 1, 0, divRoundUp(1, 6) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_6x6, 1, 1, 0, divRoundUp(1, 6) * divRoundUp(1, 6) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_8x5, 1, 1, 0, divRoundUp(1, 8) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_8x6, 1, 1, 0, divRoundUp(1, 8) * divRoundUp(1, 6) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_8x8, 1, 1, 0, divRoundUp(1, 8) * divRoundUp(1, 8) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_10x5, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_10x6, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 6) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_10x8, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 8) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_10x10, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 10) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_12x10, 1, 1, 0, divRoundUp(1, 12) * divRoundUp(1, 10) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA_ASTC_12x12, 1, 1, 0, divRoundUp(1, 12) * divRoundUp(1, 12) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4, 1, 1, 0, divRoundUp(1, 4) * divRoundUp(1, 4) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4, 1, 1, 0, divRoundUp(1, 5) * divRoundUp(1, 4) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5, 1, 1, 0, divRoundUp(1, 5) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5, 1, 1, 0, divRoundUp(1, 6) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6, 1, 1, 0, divRoundUp(1, 6) * divRoundUp(1, 6) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5, 1, 1, 0, divRoundUp(1, 8) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6, 1, 1, 0, divRoundUp(1, 8) * divRoundUp(1, 6) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8, 1, 1, 0, divRoundUp(1, 8) * divRoundUp(1, 8) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 5) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 6) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 8) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10, 1, 1, 0, divRoundUp(1, 10) * divRoundUp(1, 10) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10, 1, 1, 0, divRoundUp(1, 12) * divRoundUp(1, 10) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	    ctx.glCompressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12, 1, 1, 0, divRoundUp(1, 12) * divRoundUp(1, 12) * 16 - 1, 0);
	    ctx.expectError(GL_INVALID_VALUE);
	}
	ctx.endSection();
}